

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

optional<Token> * __thiscall
Tokenizer::NextToken(optional<Token> *__return_storage_ptr__,Tokenizer *this)

{
  Error *this_00;
  allocator<char> local_39;
  string local_38;
  
  if (this->_initialized == false) {
    readAll(this);
  }
  if (((byte)this->_rdr[*(long *)(*(long *)this->_rdr + -0x18) + 0x20] & 1) == 0) {
    if ((this->_ptr).first <
        (ulong)((long)(this->_lines_buffer).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_lines_buffer).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      nextToken(__return_storage_ptr__,this);
    }
    else {
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = false;
    }
    return __return_storage_ptr__;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"StreamError",&local_39);
  Error::Error(this_00,&local_38);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

std::optional<Token> Tokenizer::NextToken() {
	if (!_initialized)
		readAll();
	if (_rdr.bad()) {
		throw Error("StreamError");
	}
	if (isEOF()) {
		return {};
	}
	return nextToken();
}